

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O2

void __thiscall tf::Semaphore::_release(Semaphore *this,SmallVector<tf::Node_*,_2U> *dst)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  
  std::mutex::lock((mutex *)this);
  uVar3 = *(ulong *)(this + 0x30);
  if (*(ulong *)(this + 0x28) <= uVar3) {
    throw_re<char_const(&)[58],unsigned_long&>
              ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/semaphore.hpp"
               ,0x97,(char (*) [58])"can\'t release the semaphore more than its maximum value: ",
               (unsigned_long *)(this + 0x28));
    uVar3 = *(ulong *)(this + 0x30);
  }
  *(ulong *)(this + 0x30) = uVar3 + 1;
  pvVar1 = (dst->super_SmallVectorImpl<tf::Node_*>).super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pvVar2 = (dst->super_SmallVectorImpl<tf::Node_*>).super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  if (pvVar1 == pvVar2) {
    SmallVectorImpl<tf::Node_*>::swap
              (&dst->super_SmallVectorImpl<tf::Node_*>,(SmallVectorImpl<tf::Node_*> *)(this + 0x38))
    ;
  }
  else {
    SmallVectorImpl<tf::Node_*>::reserve
              (&dst->super_SmallVectorImpl<tf::Node_*>,
               (*(long *)(this + 0x40) - *(long *)(this + 0x38) >> 3) +
               ((long)pvVar2 - (long)pvVar1 >> 3));
    SmallVectorImpl<tf::Node*>::insert<tf::Node**>
              ((SmallVectorImpl<tf::Node*> *)dst,
               (iterator)
               (dst->super_SmallVectorImpl<tf::Node_*>).
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX,
               *(Node ***)(this + 0x38),*(Node ***)(this + 0x40));
    *(undefined8 *)(this + 0x40) = *(undefined8 *)(this + 0x38);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

inline void Semaphore::_release(SmallVector<Node*>& dst) {

  std::lock_guard<std::mutex> lock(_mtx);

  if(_cur_value >= _max_value) {
    TF_THROW("can't release the semaphore more than its maximum value: ", _max_value);
  }

  ++_cur_value;
  
  if(dst.empty()) {
    dst.swap(_waiters);
  }
  else {
    dst.reserve(dst.size() + _waiters.size());
    dst.insert(dst.end(), _waiters.begin(), _waiters.end());
    _waiters.clear();
  }
}